

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::accessChainStore
          (TGlslangToSpvTraverser *this,TType *type,Id rvalue)

{
  Builder *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  Op OVar1;
  Instruction *pIVar2;
  undefined8 uVar3;
  int iVar4;
  Id typeId;
  Id IVar5;
  Id IVar6;
  CoherentFlags CVar7;
  uint uVar8;
  Decoration nonUniform;
  MemoryAccessMask MVar9;
  Scope scope;
  TType *type_00;
  CoherentFlags coherentFlags;
  Id local_98;
  CoherentFlags local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  CoherentFlags local_88 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Id local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  CoherentFlags local_38;
  
  iVar4 = (*type->_vptr_TType[7])(type);
  local_98 = rvalue;
  if (iVar4 != 0xc) goto LAB_003bc10a;
  this_00 = &this->builder;
  typeId = spv::Builder::accessChainGetInferredType(this_00);
  OVar1 = (this->builder).module.idToInstruction.
          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
          super__Vector_impl_data._M_start[typeId]->opCode;
  if (OVar1 - OpTypeBool < 3) {
    IVar5 = spv::Builder::makeBoolType(this_00);
    if (typeId != IVar5) {
      IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar5 = spv::Builder::makeIntConstant(this_00,IVar5,1,false);
      IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(this_00,IVar6,0,false);
LAB_003bc076:
      local_98 = spv::Builder::createTriOp(this_00,OpSelect,typeId,rvalue,IVar5,IVar6);
      goto LAB_003bc10a;
    }
    pIVar2 = (this->builder).module.idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[rvalue];
    if (pIVar2 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar2->typeId;
    }
    if (IVar5 == typeId) goto LAB_003bc10a;
    IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar5 = spv::Builder::makeIntConstant(this_00,IVar5,0,false);
  }
  else {
    if (OVar1 != OpTypeVector) goto LAB_003bc10a;
    uVar8 = spv::Builder::getNumTypeConstituents(this_00,typeId);
    IVar5 = spv::Builder::makeBoolType(this_00);
    IVar5 = spv::Builder::makeVectorType(this_00,IVar5,uVar8);
    if (typeId != IVar5) {
      IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar5 = spv::Builder::makeIntConstant(this_00,IVar5,1,false);
      IVar5 = makeSmearedConstant(this,IVar5,uVar8);
      IVar6 = spv::Builder::makeIntegerType(this_00,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(this_00,IVar6,0,false);
      IVar6 = makeSmearedConstant(this,IVar6,uVar8);
      goto LAB_003bc076;
    }
    pIVar2 = (this->builder).module.idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[rvalue];
    if (pIVar2 == (Instruction *)0x0) {
      IVar5 = 0;
    }
    else {
      IVar5 = pIVar2->typeId;
    }
    if (IVar5 == typeId) goto LAB_003bc10a;
    IVar5 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar5 = spv::Builder::makeIntConstant(this_00,IVar5,0,false);
    IVar5 = makeSmearedConstant(this,IVar5,uVar8);
  }
  local_98 = spv::Builder::createBinOp(this_00,OpINotEqual,typeId,rvalue,IVar5);
LAB_003bc10a:
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  __x = &(this->builder).accessChain.indexChain;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__x);
  local_68 = (this->builder).accessChain.instr;
  __x_00 = &(this->builder).accessChain.swizzle;
  type_00 = (TType *)__x_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_38._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uStack_40._0_1_ = (this->builder).accessChain.isRValue;
  uStack_40._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uStack_40._4_4_ = (this->builder).accessChain.alignment;
  local_94 = local_38;
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    type_00 = (TType *)((long)local_60.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_60.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,(ulong)type_00);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    type_00 = (TType *)((long)local_80.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_80.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,(ulong)type_00);
  }
  CVar7 = TranslateCoherent((TGlslangToSpvTraverser *)type,type_00);
  local_88[0]._0_2_ = CVar7._0_2_;
  spv::Builder::AccessChain::CoherentFlags::operator|=(&local_94,local_88);
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  local_90 = __x;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,__x);
  local_68 = (this->builder).accessChain.instr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uVar3._0_1_ = (this->builder).accessChain.isRValue;
  uVar3._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uVar3._4_4_ = (this->builder).accessChain.alignment;
  local_38._0_2_ = *(undefined2 *)&(this->builder).accessChain.coherentFlags;
  uStack_40 = uVar3;
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  uVar8 = glslang::TType::getBufferReferenceAlignment(type);
  local_88[0] = (CoherentFlags)(this->builder).accessChain.base;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_80,local_90);
  local_68 = (this->builder).accessChain.instr;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,__x_00);
  local_48._0_4_ = (this->builder).accessChain.component;
  local_48._4_4_ = (this->builder).accessChain.preSwizzleBaseType;
  uStack_40._0_1_ = (this->builder).accessChain.isRValue;
  uStack_40._1_3_ = *(undefined3 *)&(this->builder).accessChain.field_0x49;
  uStack_40._4_4_ = (this->builder).accessChain.alignment;
  CVar7 = (this->builder).accessChain.coherentFlags;
  local_38._0_2_ = CVar7._0_2_;
  nonUniform = TranslateNonUniformDecoration(this,(CoherentFlags *)(ulong)(uint)CVar7);
  MVar9 = TranslateMemoryAccess(this,(CoherentFlags *)(ulong)(uint)local_94);
  scope = TranslateMemoryScope(this,(CoherentFlags *)(ulong)(uint)local_94);
  spv::Builder::accessChainStore
            (&this->builder,local_98,nonUniform,MVar9 & ~MakePointerVisible,scope,
             uVar3._4_4_ | uVar8);
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::accessChainStore(const glslang::TType& type, spv::Id rvalue)
{
    // Need to convert to abstract types when necessary
    if (type.getBasicType() == glslang::EbtBool) {
        spv::Id nominalTypeId = builder.accessChainGetInferredType();

        if (builder.isScalarType(nominalTypeId)) {
            // Conversion for bool
            spv::Id boolType = builder.makeBoolType();
            if (nominalTypeId != boolType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = builder.makeUintConstant(1);
                spv::Id zero = builder.makeUintConstant(0);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != boolType)
                rvalue = builder.createBinOp(spv::OpINotEqual, boolType, rvalue, builder.makeUintConstant(0));
        } else if (builder.isVectorType(nominalTypeId)) {
            // Conversion for bvec
            int vecSize = builder.getNumTypeComponents(nominalTypeId);
            spv::Id bvecType = builder.makeVectorType(builder.makeBoolType(), vecSize);
            if (nominalTypeId != bvecType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = makeSmearedConstant(builder.makeUintConstant(1), vecSize);
                spv::Id zero = makeSmearedConstant(builder.makeUintConstant(0), vecSize);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != bvecType)
                rvalue = builder.createBinOp(spv::OpINotEqual, bvecType, rvalue,
                                             makeSmearedConstant(builder.makeUintConstant(0), vecSize));
        }
    }

    spv::Builder::AccessChain::CoherentFlags coherentFlags = builder.getAccessChain().coherentFlags;
    coherentFlags |= TranslateCoherent(type);

    unsigned int alignment = builder.getAccessChain().alignment;
    alignment |= type.getBufferReferenceAlignment();

    builder.accessChainStore(rvalue, TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags),
                             spv::MemoryAccessMask(TranslateMemoryAccess(coherentFlags) &
                                ~spv::MemoryAccessMakePointerVisibleKHRMask),
                             TranslateMemoryScope(coherentFlags), alignment);
}